

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFTraceReader.cpp
# Opt level: O1

void __thiscall BFTraceReader::matchToken(BFTraceReader *this,Type type)

{
  Lexeme local_48;
  
  if ((this->m_current).type == type) {
    InputTokenizer::nextToken(&local_48,&this->m_tokens);
    (this->m_current).type = local_48.type;
    std::__cxx11::string::_M_assign((string *)&(this->m_current).token);
    (this->m_current).data = local_48.data;
    local_48._vptr_Lexeme = (_func_int **)&PTR__Lexeme_0012a9d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.token._M_dataplus._M_p != &local_48.token.field_2) {
      operator_delete(local_48.token._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("m_current.type == type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                ,0xb4,"void BFTraceReader::matchToken(InputTokenizer::Lexeme::Type)");
}

Assistant:

void BFTraceReader::matchToken(InputTokenizer::Lexeme::Type type) {
	assert(m_current.type == type);
	m_current = m_tokens.nextToken();
}